

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O0

void __thiscall amrex::ForkJoin::modify_ngrow(ForkJoin *this,string *name,int idx,IntVect ngrow)

{
  size_type sVar1;
  Long LVar2;
  MFFork *pMVar3;
  undefined8 in_RCX;
  int in_EDX;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *in_RDI;
  int in_R8D;
  int i;
  char *in_stack_00000168;
  int in_stack_00000174;
  char *in_stack_00000178;
  char *in_stack_00000180;
  key_type *in_stack_ffffffffffffff48;
  int local_a8;
  undefined8 local_7c;
  int local_74;
  char *local_70;
  undefined4 local_64;
  char *local_60;
  char *local_58;
  char *local_50;
  undefined4 local_44;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined4 local_24;
  char *local_20;
  char *local_18;
  int local_c;
  undefined8 *local_8;
  
  local_7c = in_RCX;
  local_74 = in_R8D;
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
          ::count(in_RDI,in_stack_ffffffffffffff48);
  if (sVar1 != 0) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
    ::operator[](in_RDI,in_stack_ffffffffffffff48);
    LVar2 = Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::size
                      ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_> *)
                       0x1211b5a);
    if (in_EDX < LVar2) goto LAB_01211bc2;
  }
  local_18 = "data.count(name) > 0 && data[name].size() > idx";
  local_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
  ;
  local_24 = 0x90;
  local_30 = "\"(name, index) pair doesn\'t exist\"";
  Assert_host(in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000168);
LAB_01211bc2:
  if (((ulong)(in_RDI->_M_h)._M_buckets & 0x100) != 0) {
    local_38 = "!flag_invoked";
    local_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
    ;
    local_44 = 0x92;
    local_50 = "\"Can only specify grow cells before first forkjoin() invocation\"";
    Assert_host(in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000168);
  }
  for (local_a8 = 0; local_a8 < 3; local_a8 = local_a8 + 1) {
    local_8 = &local_7c;
    local_c = local_a8;
    if (*(int *)((long)local_8 + (long)local_a8 * 4) < 0) {
      local_58 = "ngrow[i] >= 0";
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
      ;
      local_64 = 0x95;
      local_70 = "\"ngrow[i] must be non-negative\"";
      Assert_host(in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000168);
    }
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  ::operator[](in_RDI,in_stack_ffffffffffffff48);
  pMVar3 = Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::operator[]
                     ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_> *)
                      in_RDI,(size_type)in_stack_ffffffffffffff48);
  *(undefined8 *)(pMVar3->ngrow).vect = local_7c;
  (pMVar3->ngrow).vect[2] = local_74;
  return;
}

Assistant:

void
ForkJoin::modify_ngrow (const std::string &name, int idx, IntVect ngrow)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(data.count(name) > 0 && data[name].size() > idx,
                                     "(name, index) pair doesn't exist");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!flag_invoked,
                                     "Can only specify grow cells before first forkjoin() invocation");
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(ngrow[i] >= 0,
                                         "ngrow[i] must be non-negative");
    }
    data[name][idx].ngrow = ngrow;
}